

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_mipsdsp_multiply
               (DisasContext_conflict6 *ctx,uint32_t op1,uint32_t op2,int ret,int v1,int v2,
               int check_ret)

{
  TCGContext_conflict6 *s;
  undefined8 uVar1;
  TCGTemp *pTVar2;
  TCGTemp *a1;
  TCGv_i64 a2;
  undefined4 in_register_00000014;
  uintptr_t o_3;
  TCGv_i64 pTVar3;
  TCGOpcode opc;
  code *func;
  uintptr_t o_32;
  TCGv_i64 pTVar4;
  long lVar5;
  int iVar6;
  uintptr_t o_2;
  TCGTemp *local_78;
  TCGv_i64 local_70;
  TCGv_i64 local_68;
  TCGv_ptr local_60;
  int local_50;
  int local_4c;
  TCGTemp *local_48;
  TCGTemp *local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000014,op2);
  if (check_ret == 1 && ret == 0) {
    return;
  }
  s = ctx->uc->tcg_ctx;
  local_50 = v1;
  local_4c = v2;
  pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I32,false);
  a1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  pTVar4 = (TCGv_i64)((long)a1 - (long)s);
  local_48 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  local_40 = pTVar2;
  tcg_gen_op2_mips64el(s,INDEX_op_movi_i32,(TCGArg)pTVar2,(long)ret);
  if (local_50 == 0) {
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)a1,0);
  }
  else if (s->cpu_gpr[local_50] != pTVar4) {
    tcg_gen_op2_mips64el
              (s,INDEX_op_mov_i64,(TCGArg)a1,
               (TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[local_50]));
  }
  uVar1 = local_38;
  pTVar3 = (TCGv_i64)((long)local_48 - (long)s);
  if (local_4c == 0) {
    opc = INDEX_op_movi_i64;
    a2 = (TCGv_i64)0x0;
LAB_009bb697:
    tcg_gen_op2_mips64el(s,opc,(TCGArg)local_48,(TCGArg)a2);
  }
  else if (s->cpu_gpr[local_4c] != pTVar3) {
    a2 = (TCGv_i64)((long)&s->pool_cur + (long)s->cpu_gpr[local_4c]);
    opc = INDEX_op_mov_i64;
    goto LAB_009bb697;
  }
  lVar5 = (long)local_40 - (long)s;
  iVar6 = (int)uVar1;
  switch(op1 << 0x1e | op1 + 0x83fffff0 >> 2) {
  case 0:
    if (iVar6 < 0x7c000750) {
      if (iVar6 == 0x7c000190) {
        check_dsp(ctx);
        local_68 = (TCGv_i64)(s->cpu_env + (long)s);
        pTVar2 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
        func = helper_muleu_s_ph_qbl_mips64el;
      }
      else if (iVar6 == 0x7c0001d0) {
        check_dsp(ctx);
        local_68 = (TCGv_i64)(s->cpu_env + (long)s);
        pTVar2 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
        func = helper_muleu_s_ph_qbr_mips64el;
      }
      else {
        if (iVar6 != 0x7c000710) goto switchD_009bb6ca_caseD_3;
        check_dsp(ctx);
        local_68 = (TCGv_i64)(s->cpu_env + (long)s);
        pTVar2 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
        func = helper_muleq_s_w_phl_mips64el;
      }
    }
    else if (iVar6 == 0x7c000750) {
      check_dsp(ctx);
      local_68 = (TCGv_i64)(s->cpu_env + (long)s);
      pTVar2 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      func = helper_muleq_s_w_phr_mips64el;
    }
    else if (iVar6 == 0x7c000790) {
      check_dsp_r2(ctx);
      local_68 = (TCGv_i64)(s->cpu_env + (long)s);
      pTVar2 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      func = helper_mulq_s_ph_mips64el;
    }
    else {
      if (iVar6 != 0x7c0007d0) goto switchD_009bb6ca_caseD_3;
      check_dsp(ctx);
      local_68 = (TCGv_i64)(s->cpu_env + (long)s);
      pTVar2 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      func = helper_mulq_rs_ph_mips64el;
    }
    break;
  case 1:
    if (iVar6 < 0x7c000714) {
      if (iVar6 == 0x7c000194) {
        check_dsp(ctx);
        local_68 = (TCGv_i64)(s->cpu_env + (long)s);
        pTVar2 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
        func = helper_muleu_s_qh_obl_mips64el;
      }
      else {
        if (iVar6 != 0x7c0001d4) goto switchD_009bb6ca_caseD_3;
        check_dsp(ctx);
        local_68 = (TCGv_i64)(s->cpu_env + (long)s);
        pTVar2 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
        func = helper_muleu_s_qh_obr_mips64el;
      }
    }
    else if (iVar6 == 0x7c0007d4) {
      check_dsp(ctx);
      local_68 = (TCGv_i64)(s->cpu_env + (long)s);
      pTVar2 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      func = helper_mulq_rs_qh_mips64el;
    }
    else if (iVar6 == 0x7c000754) {
      check_dsp(ctx);
      local_68 = (TCGv_i64)(s->cpu_env + (long)s);
      pTVar2 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      func = helper_muleq_s_pw_qhr_mips64el;
    }
    else {
      if (iVar6 != 0x7c000714) goto switchD_009bb6ca_caseD_3;
      check_dsp(ctx);
      local_68 = (TCGv_i64)(s->cpu_env + (long)s);
      pTVar2 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      func = helper_muleq_s_pw_qhl_mips64el;
    }
    break;
  case 2:
    if ((ctx->hflags & 0x100000) == 0) {
      gen_mipsdsp_multiply_cold_1();
    }
    if (iVar6 < 0x7c000598) {
      if (iVar6 == 0x7c000318) {
        local_68 = (TCGv_i64)(s->cpu_env + (long)s);
        pTVar2 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
        func = helper_mul_ph_mips64el;
      }
      else {
        if (iVar6 != 0x7c000398) goto switchD_009bb6ca_caseD_3;
        local_68 = (TCGv_i64)(s->cpu_env + (long)s);
        pTVar2 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
        func = helper_mul_s_ph_mips64el;
      }
    }
    else if (iVar6 == 0x7c000598) {
      local_68 = (TCGv_i64)(s->cpu_env + (long)s);
      pTVar2 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      func = helper_mulq_s_w_mips64el;
    }
    else {
      if (iVar6 != 0x7c0005d8) goto switchD_009bb6ca_caseD_3;
      local_68 = (TCGv_i64)(s->cpu_env + (long)s);
      pTVar2 = (TCGTemp *)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)ret]);
      func = helper_mulq_rs_w_mips64el;
    }
    break;
  default:
    goto switchD_009bb6ca_caseD_3;
  case 8:
    switch((iVar6 + 0x83ffffd0U) * 0x4000000 | iVar6 + 0x83ffffd0U >> 6) {
    case 0:
      check_dsp_r2(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(lVar5 + (long)s);
      local_70 = pTVar4 + (long)s;
      local_68 = (TCGv_i64)((long)s + (long)pTVar3);
      func = helper_dpa_w_ph_mips64el;
      break;
    case 1:
      check_dsp_r2(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(lVar5 + (long)s);
      local_70 = pTVar4 + (long)s;
      local_68 = (TCGv_i64)((long)s + (long)pTVar3);
      func = helper_dps_w_ph_mips64el;
      break;
    case 2:
      check_dsp_r2(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(lVar5 + (long)s);
      local_70 = pTVar4 + (long)s;
      local_68 = (TCGv_i64)((long)s + (long)pTVar3);
      func = helper_mulsa_w_ph_mips64el;
      break;
    case 3:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(lVar5 + (long)s);
      local_70 = pTVar4 + (long)s;
      local_68 = (TCGv_i64)((long)s + (long)pTVar3);
      func = helper_dpau_h_qbl_mips64el;
      break;
    case 4:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(lVar5 + (long)s);
      local_70 = pTVar4 + (long)s;
      local_68 = (TCGv_i64)((long)s + (long)pTVar3);
      func = helper_dpaq_s_w_ph_mips64el;
      break;
    case 5:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(lVar5 + (long)s);
      local_70 = pTVar4 + (long)s;
      local_68 = (TCGv_i64)((long)s + (long)pTVar3);
      func = helper_dpsq_s_w_ph_mips64el;
      break;
    case 6:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(lVar5 + (long)s);
      local_70 = pTVar4 + (long)s;
      local_68 = (TCGv_i64)((long)s + (long)pTVar3);
      func = helper_mulsaq_s_w_ph_mips64el;
      break;
    case 7:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(lVar5 + (long)s);
      local_70 = pTVar4 + (long)s;
      local_68 = (TCGv_i64)((long)s + (long)pTVar3);
      func = helper_dpau_h_qbr_mips64el;
      break;
    case 8:
      check_dsp_r2(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(lVar5 + (long)s);
      local_70 = pTVar4 + (long)s;
      local_68 = (TCGv_i64)((long)s + (long)pTVar3);
      func = helper_dpax_w_ph_mips64el;
      break;
    case 9:
      check_dsp_r2(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(lVar5 + (long)s);
      local_70 = pTVar4 + (long)s;
      local_68 = (TCGv_i64)((long)s + (long)pTVar3);
      func = helper_dpsx_w_ph_mips64el;
      break;
    default:
      goto switchD_009bb6ca_caseD_3;
    case 0xb:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(lVar5 + (long)s);
      local_70 = pTVar4 + (long)s;
      local_68 = (TCGv_i64)((long)s + (long)pTVar3);
      func = helper_dpsu_h_qbl_mips64el;
      break;
    case 0xc:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(lVar5 + (long)s);
      local_70 = pTVar4 + (long)s;
      local_68 = (TCGv_i64)((long)s + (long)pTVar3);
      func = helper_dpaq_sa_l_w_mips64el;
      break;
    case 0xd:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(lVar5 + (long)s);
      local_70 = pTVar4 + (long)s;
      local_68 = (TCGv_i64)((long)s + (long)pTVar3);
      func = helper_dpsq_sa_l_w_mips64el;
      break;
    case 0xf:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(lVar5 + (long)s);
      local_70 = pTVar4 + (long)s;
      local_68 = (TCGv_i64)((long)s + (long)pTVar3);
      func = helper_dpsu_h_qbr_mips64el;
      break;
    case 0x10:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(lVar5 + (long)s);
      local_70 = pTVar4 + (long)s;
      local_68 = (TCGv_i64)((long)s + (long)pTVar3);
      func = helper_maq_sa_w_phl_mips64el;
      break;
    case 0x12:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(lVar5 + (long)s);
      local_70 = pTVar4 + (long)s;
      local_68 = (TCGv_i64)((long)s + (long)pTVar3);
      func = helper_maq_sa_w_phr_mips64el;
      break;
    case 0x14:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(lVar5 + (long)s);
      local_70 = pTVar4 + (long)s;
      local_68 = (TCGv_i64)((long)s + (long)pTVar3);
      func = helper_maq_s_w_phl_mips64el;
      break;
    case 0x16:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(lVar5 + (long)s);
      local_70 = pTVar4 + (long)s;
      local_68 = (TCGv_i64)((long)s + (long)pTVar3);
      func = helper_maq_s_w_phr_mips64el;
      break;
    case 0x18:
      check_dsp_r2(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(lVar5 + (long)s);
      local_70 = pTVar4 + (long)s;
      local_68 = (TCGv_i64)((long)s + (long)pTVar3);
      func = helper_dpaqx_s_w_ph_mips64el;
      break;
    case 0x19:
      check_dsp_r2(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(lVar5 + (long)s);
      local_70 = pTVar4 + (long)s;
      local_68 = (TCGv_i64)((long)s + (long)pTVar3);
      func = helper_dpsqx_s_w_ph_mips64el;
      break;
    case 0x1a:
      check_dsp_r2(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(lVar5 + (long)s);
      local_70 = pTVar4 + (long)s;
      local_68 = (TCGv_i64)((long)s + (long)pTVar3);
      func = helper_dpaqx_sa_w_ph_mips64el;
      break;
    case 0x1b:
      check_dsp_r2(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(lVar5 + (long)s);
      local_70 = pTVar4 + (long)s;
      local_68 = (TCGv_i64)((long)s + (long)pTVar3);
      func = helper_dpsqx_sa_w_ph_mips64el;
    }
    goto LAB_009bc812;
  case 9:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i32,(TCGArg)local_40,(ulong)(ret & 3));
    switch((iVar6 + 0x83ffffccU) * 0x4000000 | iVar6 + 0x83ffffccU >> 6) {
    case 0:
      check_dsp_r2(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)((long)s + lVar5);
      func = helper_dpa_w_qh_mips64el;
      break;
    case 1:
      check_dsp_r2(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)((long)s + lVar5);
      func = helper_dps_w_qh_mips64el;
      break;
    default:
      goto switchD_009bb6ca_caseD_3;
    case 3:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)((long)s + lVar5);
      func = helper_dpau_h_obl_mips64el;
      break;
    case 4:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)((long)s + lVar5);
      func = helper_dpaq_s_w_qh_mips64el;
      break;
    case 5:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)((long)s + lVar5);
      func = helper_dpsq_s_w_qh_mips64el;
      break;
    case 6:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)((long)s + lVar5);
      func = helper_mulsaq_s_w_qh_mips64el;
      break;
    case 7:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)((long)s + lVar5);
      func = helper_dpau_h_obr_mips64el;
      break;
    case 0xb:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)((long)s + lVar5);
      func = helper_dpsu_h_obl_mips64el;
      break;
    case 0xc:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)((long)s + lVar5);
      func = helper_dpaq_sa_l_pw_mips64el;
      break;
    case 0xd:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)((long)s + lVar5);
      func = helper_dpsq_sa_l_pw_mips64el;
      break;
    case 0xe:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)((long)s + lVar5);
      func = helper_mulsaq_s_l_pw_mips64el;
      break;
    case 0xf:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)((long)s + lVar5);
      func = helper_dpsu_h_obr_mips64el;
      break;
    case 0x10:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)((long)s + lVar5);
      func = helper_maq_sa_w_qhll_mips64el;
      break;
    case 0x11:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)((long)s + lVar5);
      func = helper_maq_sa_w_qhlr_mips64el;
      break;
    case 0x12:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)((long)s + lVar5);
      func = helper_maq_sa_w_qhrl_mips64el;
      break;
    case 0x13:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)((long)s + lVar5);
      func = helper_maq_sa_w_qhrr_mips64el;
      break;
    case 0x14:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)((long)s + lVar5);
      func = helper_maq_s_w_qhll_mips64el;
      break;
    case 0x15:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)((long)s + lVar5);
      func = helper_maq_s_w_qhlr_mips64el;
      break;
    case 0x16:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)((long)s + lVar5);
      func = helper_maq_s_w_qhrl_mips64el;
      break;
    case 0x17:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)((long)s + lVar5);
      func = helper_maq_s_w_qhrr_mips64el;
      break;
    case 0x19:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)(lVar5 + (long)s);
      func = helper_dmadd_mips64el;
      break;
    case 0x1b:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)((long)s + lVar5);
      func = helper_dmsub_mips64el;
      break;
    case 0x1c:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)((long)s + lVar5);
      func = helper_maq_s_l_pwl_mips64el;
      break;
    case 0x1d:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)((long)s + lVar5);
      func = helper_dmaddu_mips64el;
      break;
    case 0x1e:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)((long)s + lVar5);
      func = helper_maq_s_l_pwr_mips64el;
      break;
    case 0x1f:
      check_dsp(ctx);
      local_60 = s->cpu_env + (long)s;
      local_78 = (TCGTemp *)(pTVar4 + (long)s);
      local_70 = pTVar3 + (long)s;
      local_68 = (TCGv_i64)((long)s + lVar5);
      func = helper_dmsubu_mips64el;
    }
LAB_009bc812:
    pTVar2 = (TCGTemp *)0x0;
    iVar6 = 4;
    goto LAB_009bc81c;
  }
  local_70 = pTVar3 + (long)s;
  local_78 = (TCGTemp *)(pTVar4 + (long)s);
  iVar6 = 3;
LAB_009bc81c:
  tcg_gen_callN_mips64el(s,func,pTVar2,iVar6,&local_78);
switchD_009bb6ca_caseD_3:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(lVar5 + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar4 + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar3 + (long)s));
  return;
}

Assistant:

static void gen_mipsdsp_multiply(DisasContext *ctx, uint32_t op1, uint32_t op2,
                                 int ret, int v1, int v2, int check_ret)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0;
    TCGv v1_t;
    TCGv v2_t;

    if ((ret == 0) && (check_ret == 1)) {
        /* Treat as NOP. */
        return;
    }

    t0 = tcg_temp_new_i32(tcg_ctx);
    v1_t = tcg_temp_new(tcg_ctx);
    v2_t = tcg_temp_new(tcg_ctx);

    tcg_gen_movi_i32(tcg_ctx, t0, ret);
    gen_load_gpr(tcg_ctx, v1_t, v1);
    gen_load_gpr(tcg_ctx, v2_t, v2);

    switch (op1) {
    /*
     * OPC_MULT_G_2E, OPC_ADDUH_QB_DSP, OPC_MUL_PH_DSP have
     * the same mask and op1.
     */
    case OPC_MULT_G_2E:
        check_dsp_r2(ctx);
        switch (op2) {
        case  OPC_MUL_PH:
            gen_helper_mul_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case  OPC_MUL_S_PH:
            gen_helper_mul_s_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULQ_S_W:
            gen_helper_mulq_s_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULQ_RS_W:
            gen_helper_mulq_rs_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        }
        break;
    case OPC_DPA_W_PH_DSP:
        switch (op2) {
        case OPC_DPAU_H_QBL:
            check_dsp(ctx);
            gen_helper_dpau_h_qbl(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPAU_H_QBR:
            check_dsp(ctx);
            gen_helper_dpau_h_qbr(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPSU_H_QBL:
            check_dsp(ctx);
            gen_helper_dpsu_h_qbl(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPSU_H_QBR:
            check_dsp(ctx);
            gen_helper_dpsu_h_qbr(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPA_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpa_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPAX_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpax_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPAQ_S_W_PH:
            check_dsp(ctx);
            gen_helper_dpaq_s_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPAQX_S_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpaqx_s_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPAQX_SA_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpaqx_sa_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPS_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dps_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPSX_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpsx_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPSQ_S_W_PH:
            check_dsp(ctx);
            gen_helper_dpsq_s_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPSQX_S_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpsqx_s_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPSQX_SA_W_PH:
            check_dsp_r2(ctx);
            gen_helper_dpsqx_sa_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULSAQ_S_W_PH:
            check_dsp(ctx);
            gen_helper_mulsaq_s_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPAQ_SA_L_W:
            check_dsp(ctx);
            gen_helper_dpaq_sa_l_w(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_DPSQ_SA_L_W:
            check_dsp(ctx);
            gen_helper_dpsq_sa_l_w(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MAQ_S_W_PHL:
            check_dsp(ctx);
            gen_helper_maq_s_w_phl(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MAQ_S_W_PHR:
            check_dsp(ctx);
            gen_helper_maq_s_w_phr(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MAQ_SA_W_PHL:
            check_dsp(ctx);
            gen_helper_maq_sa_w_phl(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MAQ_SA_W_PHR:
            check_dsp(ctx);
            gen_helper_maq_sa_w_phr(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULSA_W_PH:
            check_dsp_r2(ctx);
            gen_helper_mulsa_w_ph(tcg_ctx, t0, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        }
        break;
#ifdef TARGET_MIPS64
    case OPC_DPAQ_W_QH_DSP:
        {
            int ac = ret & 0x03;
            tcg_gen_movi_i32(tcg_ctx, t0, ac);

            switch (op2) {
            case OPC_DMADD:
                check_dsp(ctx);
                gen_helper_dmadd(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DMADDU:
                check_dsp(ctx);
                gen_helper_dmaddu(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DMSUB:
                check_dsp(ctx);
                gen_helper_dmsub(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DMSUBU:
                check_dsp(ctx);
                gen_helper_dmsubu(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPA_W_QH:
                check_dsp_r2(ctx);
                gen_helper_dpa_w_qh(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPAQ_S_W_QH:
                check_dsp(ctx);
                gen_helper_dpaq_s_w_qh(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPAQ_SA_L_PW:
                check_dsp(ctx);
                gen_helper_dpaq_sa_l_pw(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPAU_H_OBL:
                check_dsp(ctx);
                gen_helper_dpau_h_obl(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPAU_H_OBR:
                check_dsp(ctx);
                gen_helper_dpau_h_obr(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPS_W_QH:
                check_dsp_r2(ctx);
                gen_helper_dps_w_qh(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPSQ_S_W_QH:
                check_dsp(ctx);
                gen_helper_dpsq_s_w_qh(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPSQ_SA_L_PW:
                check_dsp(ctx);
                gen_helper_dpsq_sa_l_pw(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPSU_H_OBL:
                check_dsp(ctx);
                gen_helper_dpsu_h_obl(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_DPSU_H_OBR:
                check_dsp(ctx);
                gen_helper_dpsu_h_obr(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_S_L_PWL:
                check_dsp(ctx);
                gen_helper_maq_s_l_pwl(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_S_L_PWR:
                check_dsp(ctx);
                gen_helper_maq_s_l_pwr(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_S_W_QHLL:
                check_dsp(ctx);
                gen_helper_maq_s_w_qhll(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_SA_W_QHLL:
                check_dsp(ctx);
                gen_helper_maq_sa_w_qhll(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_S_W_QHLR:
                check_dsp(ctx);
                gen_helper_maq_s_w_qhlr(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_SA_W_QHLR:
                check_dsp(ctx);
                gen_helper_maq_sa_w_qhlr(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_S_W_QHRL:
                check_dsp(ctx);
                gen_helper_maq_s_w_qhrl(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_SA_W_QHRL:
                check_dsp(ctx);
                gen_helper_maq_sa_w_qhrl(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_S_W_QHRR:
                check_dsp(ctx);
                gen_helper_maq_s_w_qhrr(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MAQ_SA_W_QHRR:
                check_dsp(ctx);
                gen_helper_maq_sa_w_qhrr(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MULSAQ_S_L_PW:
                check_dsp(ctx);
                gen_helper_mulsaq_s_l_pw(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            case OPC_MULSAQ_S_W_QH:
                check_dsp(ctx);
                gen_helper_mulsaq_s_w_qh(tcg_ctx, v1_t, v2_t, t0, tcg_ctx->cpu_env);
                break;
            }
        }
        break;
#endif
    case OPC_ADDU_QB_DSP:
        switch (op2) {
        case OPC_MULEU_S_PH_QBL:
            check_dsp(ctx);
            gen_helper_muleu_s_ph_qbl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULEU_S_PH_QBR:
            check_dsp(ctx);
            gen_helper_muleu_s_ph_qbr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULQ_RS_PH:
            check_dsp(ctx);
            gen_helper_mulq_rs_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULEQ_S_W_PHL:
            check_dsp(ctx);
            gen_helper_muleq_s_w_phl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULEQ_S_W_PHR:
            check_dsp(ctx);
            gen_helper_muleq_s_w_phr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULQ_S_PH:
            check_dsp_r2(ctx);
            gen_helper_mulq_s_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        }
        break;
#ifdef TARGET_MIPS64
    case OPC_ADDU_OB_DSP:
        switch (op2) {
        case OPC_MULEQ_S_PW_QHL:
            check_dsp(ctx);
            gen_helper_muleq_s_pw_qhl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULEQ_S_PW_QHR:
            check_dsp(ctx);
            gen_helper_muleq_s_pw_qhr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULEU_S_QH_OBL:
            check_dsp(ctx);
            gen_helper_muleu_s_qh_obl(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULEU_S_QH_OBR:
            check_dsp(ctx);
            gen_helper_muleu_s_qh_obr(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_MULQ_RS_QH:
            check_dsp(ctx);
            gen_helper_mulq_rs_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        }
        break;
#endif
    }

    tcg_temp_free_i32(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, v1_t);
    tcg_temp_free(tcg_ctx, v2_t);
}